

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint numberOfCgSets;
  double dVar1;
  double *pdVar2;
  local_int_t lVar3;
  local_int_t lVar4;
  int iVar5;
  int iVar6;
  Geometry *geom;
  double *pdVar7;
  ostream *poVar8;
  Vector *b_00;
  ulong uVar9;
  int iVar10;
  uint global_failure;
  SparseMatrix *pSVar11;
  double *vv;
  Vector *x_00;
  ulong uVar12;
  local_int_t localLength;
  Vector *xexact_00;
  ulong uVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  int niters;
  double *local_2b8;
  double normr0;
  double normr;
  int local_2a0;
  int local_29c;
  double *local_298;
  double *local_290;
  Vector x;
  Vector b;
  CGData data;
  Vector b_computed;
  Vector x_overlap;
  int argc_local;
  Vector xexact;
  HPCG_Params params;
  TestNormsData testnorms_data;
  char **argv_local;
  SparseMatrix A;
  TestSymmetryData testsymmetry_data;
  TestCGData testcg_data;
  
  argc_local = argc;
  argv_local = argv;
  HPCG_Init(&argc_local,&argv_local,&params);
  iVar10 = params.runningTime;
  local_2b8 = (double *)CONCAT44(local_2b8._4_4_,params.comm_size);
  iVar5 = CheckAspectRatio(0.125,params.nx,params.ny,params.nz,"local problem",params.comm_rank == 0
                          );
  if (iVar5 == 0) {
    local_2a0 = iVar10;
    geom = (Geometry *)operator_new(0x80);
    GenerateGeometry((int)local_2b8,params.comm_rank,params.numThreads,params.pz,params.zl,params.zu
                     ,params.nx,params.ny,params.nz,params.npx,params.npy,params.npz,geom);
    iVar5 = CheckAspectRatio(0.125,geom->npx,geom->npy,geom->npz,"process grid",
                             params.comm_rank == 0);
    if (iVar5 == 0) {
      local_29c = params.comm_rank;
      local_2b8 = (double *)operator_new(0x50);
      *local_2b8 = 0.0;
      local_2b8[1] = 0.0;
      local_2b8[2] = 0.0;
      local_2b8[3] = 0.0;
      local_2b8[4] = 0.0;
      local_2b8[5] = 0.0;
      local_2b8[6] = 0.0;
      local_2b8[7] = 0.0;
      local_2b8[8] = 0.0;
      local_2b8[9] = 0.0;
      dVar17 = mytimer();
      A.globalToLocalMap._M_h._M_buckets = &A.globalToLocalMap._M_h._M_single_bucket;
      A.globalToLocalMap._M_h._M_bucket_count = 1;
      A.globalToLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      A.globalToLocalMap._M_h._M_element_count = 0;
      A.globalToLocalMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      A.globalToLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
      A.globalToLocalMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      A.title = (char *)0x0;
      A.totalNumberOfRows = 0;
      A.totalNumberOfNonzeros._0_4_ = 0;
      A.totalNumberOfNonzeros._4_4_ = 0;
      A.localNumberOfRows = 0;
      A.localNumberOfColumns = 0;
      A.localNumberOfNonzeros = 0;
      A.nonzerosInRow = (char *)0x0;
      A.mtxIndG = (global_int_t **)0x0;
      A.mtxIndL = (local_int_t **)0x0;
      A.matrixValues = (double **)0x0;
      A.matrixDiagonal = (double **)0x0;
      A.isDotProductOptimized = true;
      A.isSpmvOptimized = true;
      A.isMgOptimized = true;
      A.isWaxpbyOptimized = true;
      A.Ac = (SparseMatrix_STRUCT *)0x0;
      A.mgData = (MGData *)0x0;
      b_00 = &b;
      x_00 = &x;
      xexact_00 = &xexact;
      A.geom = geom;
      GenerateProblem(&A,b_00,x_00,xexact_00);
      pSVar11 = &A;
      SetupHalo(pSVar11);
      iVar10 = 3;
      do {
        GenerateCoarseProblem(pSVar11);
        pSVar11 = pSVar11->Ac;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      dVar1 = mytimer();
      local_2b8[9] = dVar1 - dVar17;
      pSVar11 = &A;
      iVar10 = 4;
      do {
        CheckProblem(pSVar11,b_00,x_00,xexact_00);
        lVar3 = A.localNumberOfRows;
        pSVar11 = pSVar11->Ac;
        b_00 = (Vector *)0x0;
        x_00 = (Vector *)0x0;
        xexact_00 = (Vector *)0x0;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      uVar9 = (long)A.localNumberOfRows * 8;
      lVar4 = A.localNumberOfColumns;
      uVar13 = A._36_8_ & 0xffffffff;
      data.r.localLength = A.localNumberOfRows;
      if ((long)A.localNumberOfRows < 0) {
        uVar9 = 0xffffffffffffffff;
      }
      data.r.values = (double *)operator_new__(uVar9);
      data.r.optimizationData = (void *)0x0;
      data.z.localLength = lVar4;
      uVar12 = uVar13 * 8;
      if (lVar4 < 0) {
        uVar12 = 0xffffffffffffffff;
      }
      data.z.values = (double *)operator_new__(uVar12);
      data.z.optimizationData = (void *)0x0;
      data.p.localLength = lVar4;
      data.p.values = (double *)operator_new__(uVar12);
      data.p.optimizationData = (void *)0x0;
      data.Ap.localLength = lVar3;
      data.Ap.values = (double *)operator_new__(uVar9);
      data.Ap.optimizationData = (void *)0x0;
      x_overlap.localLength = lVar4;
      pdVar7 = (double *)operator_new__(uVar12);
      x_overlap.optimizationData = (void *)0x0;
      b_computed.localLength = lVar3;
      x_overlap.values = pdVar7;
      b_computed.values = (double *)operator_new__(uVar9);
      b_computed.optimizationData = (void *)0x0;
      if (0 < lVar4) {
        uVar9 = 0;
        do {
          iVar10 = rand();
          pdVar7[uVar9] = (double)iVar10 / 2147483647.0 + 1.0;
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
      }
      bVar14 = local_2a0 != 0;
      dVar17 = mytimer();
      iVar10 = (uint)bVar14 * 9 + 1;
      local_290 = (double *)CONCAT44(local_290._4_4_,iVar10);
      do {
        iVar5 = ComputeSPMV_ref(&A,&x_overlap,&b_computed);
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&HPCG_fout,"Error in call to SpMV: ",0x17);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        iVar5 = ComputeMG_ref(&A,&b_computed,&x_overlap);
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&HPCG_fout,"Error in call to MG: ",0x15);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      dVar1 = mytimer();
      local_2b8[8] = (dVar1 - dVar17) / (double)(int)local_290;
      niters = 0;
      normr = 0.0;
      normr0 = 0.0;
      pdVar7 = (double *)operator_new(0x48);
      iVar10 = local_29c;
      pdVar7[6] = 0.0;
      pdVar7[7] = 0.0;
      pdVar7[4] = 0.0;
      pdVar7[5] = 0.0;
      pdVar7[2] = 0.0;
      pdVar7[3] = 0.0;
      *pdVar7 = 0.0;
      pdVar7[1] = 0.0;
      pdVar7[8] = 0.0;
      if (0 < (long)x.localLength) {
        memset(x.values,0,(long)x.localLength << 3);
      }
      local_290 = pdVar7;
      iVar5 = CG_ref(&A,&data,&b,&x,0x32,0.0,&niters,&normr,&normr0,pdVar7,true);
      if ((iVar10 == 0) && (iVar5 != 0)) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," error(s) in call(s) to reference CG.",0x25);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      dVar17 = normr / normr0;
      local_298 = (double *)mytimer();
      OptimizeProblem(&A,&data,&b,&x,&xexact);
      dVar1 = mytimer();
      local_2b8[7] = dVar1 - (double)local_298;
      testcg_data.count_pass = 0;
      testcg_data.count_fail = 0;
      TestCG(&A,&data,&b,&x,&testcg_data);
      TestSymmetry(&A,&b,&xexact,&testsymmetry_data);
      niters = 0;
      normr = 0.0;
      normr0 = 0.0;
      pdVar7 = (double *)operator_new(0x48);
      pdVar7[6] = 0.0;
      pdVar7[7] = 0.0;
      pdVar7[4] = 0.0;
      pdVar7[5] = 0.0;
      pdVar7[2] = 0.0;
      pdVar7[3] = 0.0;
      *pdVar7 = 0.0;
      pdVar7[1] = 0.0;
      pdVar7[8] = 0.0;
      if ((long)x.localLength < 1) {
        uVar15 = 0;
        uVar16 = 0;
      }
      else {
        memset(x.values,0,(long)x.localLength << 3);
        uVar15 = SUB84(*pdVar7,0);
        uVar16 = (undefined4)((ulong)*pdVar7 >> 0x20);
      }
      local_298 = pdVar7;
      iVar6 = CG(&A,&data,&b,&x,500,dVar17,&niters,&normr,&normr0,pdVar7,true);
      dVar17 = dVar17 * 1.000001;
      dVar1 = normr / normr0;
      iVar5 = 0x32;
      if (0x32 < niters) {
        iVar5 = niters;
      }
      dVar18 = *pdVar7;
      if ((iVar10 == 0) && (iVar6 != 0)) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," error(s) in call(s) to optimized CG.",0x25);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      global_failure = (uint)(dVar17 < dVar1);
      if ((iVar10 == 0) && (dVar17 < dVar1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&HPCG_fout,"Failed to reduce the residual ",0x1e);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,(uint)(dVar17 < dVar1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," times.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        global_failure = 1;
        std::ostream::flush();
      }
      dVar18 = dVar18 - (double)CONCAT44(uVar16,uVar15);
      if (dVar18 <= 0.0) {
        dVar18 = 0.0;
      }
      iVar10 = (int)((double)params.runningTime / dVar18);
      numberOfCgSets = iVar10 + 1;
      uVar9 = 0xffffffffffffffff;
      if (-2 < iVar10) {
        uVar9 = (long)(int)numberOfCgSets << 3;
      }
      testnorms_data.samples = numberOfCgSets;
      testnorms_data.values = (double *)operator_new__(uVar9);
      if (-1 < iVar10) {
        uVar9 = 0;
        do {
          if (0 < (long)x.localLength) {
            memset(x.values,0,(long)x.localLength << 3);
          }
          iVar10 = CG(&A,&data,&b,&x,iVar5,0.0,&niters,&normr,&normr0,local_2b8,true);
          if (iVar10 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&HPCG_fout,"Error in call to CG: ",0x15);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          if (local_29c == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HPCG_fout,"Call [",6);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,(int)uVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] Scaled Residual [",0x13);
            poVar8 = std::ostream::_M_insert<double>(normr / normr0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          testnorms_data.values[uVar9] = normr / normr0;
          uVar9 = uVar9 + 1;
        } while (numberOfCgSets != uVar9);
      }
      pdVar2 = local_290;
      pdVar7 = local_298;
      TestNorms(&testnorms_data);
      ReportResults(&A,4,numberOfCgSets,0x32,iVar5,local_2b8,&testcg_data,&testsymmetry_data,
                    &testnorms_data,global_failure,local_2a0 == 0);
      DeleteMatrix(&A);
      if (data.r.values != (double *)0x0) {
        operator_delete__(data.r.values);
      }
      data.r.localLength = 0;
      if (data.z.values != (double *)0x0) {
        operator_delete__(data.z.values);
      }
      data.z.localLength = 0;
      if (data.p.values != (double *)0x0) {
        operator_delete__(data.p.values);
      }
      data.p.localLength = 0;
      if (data.Ap.values != (double *)0x0) {
        operator_delete__(data.Ap.values);
      }
      data.Ap.localLength = 0;
      if (x.values != (double *)0x0) {
        operator_delete__(x.values);
      }
      x.localLength = 0;
      if (b.values != (double *)0x0) {
        operator_delete__(b.values);
      }
      b.localLength = 0;
      if (xexact.values != (double *)0x0) {
        operator_delete__(xexact.values);
      }
      xexact.localLength = 0;
      if (x_overlap.values != (double *)0x0) {
        operator_delete__(x_overlap.values);
      }
      x_overlap.localLength = 0;
      if (b_computed.values != (double *)0x0) {
        operator_delete__(b_computed.values);
      }
      b_computed.localLength = 0;
      if (testnorms_data.values != (double *)0x0) {
        operator_delete__(testnorms_data.values);
      }
      HPCG_Finalize();
      operator_delete(pdVar7,0x48);
      operator_delete(pdVar2,0x48);
      if (A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)A.localToGlobalMap.
                              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)A.localToGlobalMap.
                              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<long_long,_std::pair<const_long_long,_int>,_std::allocator<std::pair<const_long_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&A.globalToLocalMap._M_h);
      operator_delete(local_2b8,0x50);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char * argv[]) {

#ifndef HPCG_NO_MPI
  MPI_Init(&argc, &argv);
#endif

  HPCG_Params params;

  HPCG_Init(&argc, &argv, params);

  // Check if QuickPath option is enabled.
  // If the running time is set to zero, we minimize all paths through the program
  bool quickPath = (params.runningTime==0);

  int size = params.comm_size, rank = params.comm_rank; // Number of MPI processes, My process ID

#ifdef HPCG_DETAILED_DEBUG
  if (size < 100 && rank==0) HPCG_fout << "Process "<<rank<<" of "<<size<<" is alive with " << params.numThreads << " threads." <<endl;

  if (rank==0) {
    char c;
    std::cout << "Press key to continue"<< std::endl;
    std::cin.get(c);
  }
#ifndef HPCG_NO_MPI
  MPI_Barrier(MPI_COMM_WORLD);
#endif
#endif

  local_int_t nx,ny,nz;
  nx = (local_int_t)params.nx;
  ny = (local_int_t)params.ny;
  nz = (local_int_t)params.nz;
  int ierr = 0;  // Used to check return codes on function calls

  ierr = CheckAspectRatio(0.125, nx, ny, nz, "local problem", rank==0);
  if (ierr)
    return ierr;

  /////////////////////////
  // Problem setup Phase //
  /////////////////////////

#ifdef HPCG_DEBUG
  double t1 = mytimer();
#endif

  // Construct the geometry and linear system
  Geometry * geom = new Geometry;
  GenerateGeometry(size, rank, params.numThreads, params.pz, params.zl, params.zu, nx, ny, nz, params.npx, params.npy, params.npz, geom);

  ierr = CheckAspectRatio(0.125, geom->npx, geom->npy, geom->npz, "process grid", rank==0);
  if (ierr)
    return ierr;

  // Use this array for collecting timing information
  std::vector< double > times(10,0.0);

  double setup_time = mytimer();

  SparseMatrix A;
  InitializeSparseMatrix(A, geom);

  Vector b, x, xexact;
  GenerateProblem(A, &b, &x, &xexact);
  SetupHalo(A);
  int numberOfMgLevels = 4; // Number of levels including first
  SparseMatrix * curLevelMatrix = &A;
  for (int level = 1; level< numberOfMgLevels; ++level) {
    GenerateCoarseProblem(*curLevelMatrix);
    curLevelMatrix = curLevelMatrix->Ac; // Make the just-constructed coarse grid the next level
  }

  setup_time = mytimer() - setup_time; // Capture total time of setup
  times[9] = setup_time; // Save it for reporting

  curLevelMatrix = &A;
  Vector * curb = &b;
  Vector * curx = &x;
  Vector * curxexact = &xexact;
  for (int level = 0; level< numberOfMgLevels; ++level) {
     CheckProblem(*curLevelMatrix, curb, curx, curxexact);
     curLevelMatrix = curLevelMatrix->Ac; // Make the nextcoarse grid the next level
     curb = 0; // No vectors after the top level
     curx = 0;
     curxexact = 0;
  }


  CGData data;
  InitializeSparseCGData(A, data);



  ////////////////////////////////////
  // Reference SpMV+MG Timing Phase //
  ////////////////////////////////////

  // Call Reference SpMV and MG. Compute Optimization time as ratio of times in these routines

  local_int_t nrow = A.localNumberOfRows;
  local_int_t ncol = A.localNumberOfColumns;

  Vector x_overlap, b_computed;
  InitializeVector(x_overlap, ncol); // Overlapped copy of x vector
  InitializeVector(b_computed, nrow); // Computed RHS vector


  // Record execution time of reference SpMV and MG kernels for reporting times
  // First load vector with random values
  FillRandomVector(x_overlap);

  int numberOfCalls = 10;
  if (quickPath) numberOfCalls = 1; //QuickPath means we do on one call of each block of repetitive code
  double t_begin = mytimer();
  for (int i=0; i< numberOfCalls; ++i) {
    ierr = ComputeSPMV_ref(A, x_overlap, b_computed); // b_computed = A*x_overlap
    if (ierr) HPCG_fout << "Error in call to SpMV: " << ierr << ".\n" << endl;
    ierr = ComputeMG_ref(A, b_computed, x_overlap); // b_computed = Minv*y_overlap
    if (ierr) HPCG_fout << "Error in call to MG: " << ierr << ".\n" << endl;
  }
  times[8] = (mytimer() - t_begin)/((double) numberOfCalls);  // Total time divided by number of calls.
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total SpMV+MG timing phase execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

  ///////////////////////////////
  // Reference CG Timing Phase //
  ///////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  int global_failure = 0; // assume all is well: no failures

  int niters = 0;
  int totalNiters_ref = 0;
  double normr = 0.0;
  double normr0 = 0.0;
  int refMaxIters = 50;
  numberOfCalls = 1; // Only need to run the residual reduction analysis once

  // Compute the residual reduction for the natural ordering and reference kernels
  std::vector< double > ref_times(9,0.0);
  double tolerance = 0.0; // Set tolerance to zero to make all runs do maxIters iterations
  int err_count = 0;
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x);
    ierr = CG_ref( A, data, b, x, refMaxIters, tolerance, niters, normr, normr0, &ref_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    totalNiters_ref += niters;
  }
  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to reference CG." << endl;
  double refTolerance = normr / normr0;

  // Call user-tunable set up function.
  double t7 = mytimer();
  OptimizeProblem(A, data, b, x, xexact);
  t7 = mytimer() - t7;
  times[7] = t7;
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total problem setup time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DETAILED_DEBUG
  if (geom->size == 1) WriteProblem(*geom, A, b, x, xexact);
#endif


  //////////////////////////////
  // Validation Testing Phase //
  //////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  TestCGData testcg_data;
  testcg_data.count_pass = testcg_data.count_fail = 0;
  TestCG(A, data, b, x, testcg_data);

  TestSymmetryData testsymmetry_data;
  TestSymmetry(A, b, xexact, testsymmetry_data);

#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total validation (TestCG and TestSymmetry) execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif

  //////////////////////////////
  // Optimized CG Setup Phase //
  //////////////////////////////

  niters = 0;
  normr = 0.0;
  normr0 = 0.0;
  err_count = 0;
  int tolerance_failures = 0;

  int optMaxIters = 10*refMaxIters;
  int optNiters = refMaxIters;
  double opt_worst_time = 0.0;

  std::vector< double > opt_times(9,0.0);

  // Compute the residual reduction and residual count for the user ordering and optimized kernels.
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x); // start x at all zeros
    double last_cummulative_time = opt_times[0];
    ierr = CG( A, data, b, x, optMaxIters, refTolerance, niters, normr, normr0, &opt_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    // Convergence check accepts an error of no more than 6 significant digits of relTolerance
    if (normr / normr0 > refTolerance * (1.0 + 1.0e-6)) ++tolerance_failures; // the number of failures to reduce residual

    // pick the largest number of iterations to guarantee convergence
    if (niters > optNiters) optNiters = niters;

    double current_time = opt_times[0] - last_cummulative_time;
    if (current_time > opt_worst_time) opt_worst_time = current_time;
  }

#ifndef HPCG_NO_MPI
// Get the absolute worst time across all MPI ranks (time in CG can be different)
  double local_opt_worst_time = opt_worst_time;
  MPI_Allreduce(&local_opt_worst_time, &opt_worst_time, 1, MPI_DOUBLE, MPI_MAX, MPI_COMM_WORLD);
#endif


  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to optimized CG." << endl;
  if (tolerance_failures) {
    global_failure = 1;
    if (rank == 0)
      HPCG_fout << "Failed to reduce the residual " << tolerance_failures << " times." << endl;
  }

  ///////////////////////////////
  // Optimized CG Timing Phase //
  ///////////////////////////////

  // Here we finally run the benchmark phase
  // The variable total_runtime is the target benchmark execution time in seconds

  double total_runtime = params.runningTime;
  int numberOfCgSets = int(total_runtime / opt_worst_time) + 1; // Run at least once, account for rounding

#ifdef HPCG_DEBUG
  if (rank==0) {
    HPCG_fout << "Projected running time: " << total_runtime << " seconds" << endl;
    HPCG_fout << "Number of CG sets: " << numberOfCgSets << endl;
  }
#endif

  /* This is the timed run for a specified amount of time. */

  optMaxIters = optNiters;
  double optTolerance = 0.0;  // Force optMaxIters iterations
  TestNormsData testnorms_data;
  testnorms_data.samples = numberOfCgSets;
  testnorms_data.values = new double[numberOfCgSets];

  for (int i=0; i< numberOfCgSets; ++i) {
    ZeroVector(x); // Zero out x
    ierr = CG( A, data, b, x, optMaxIters, optTolerance, niters, normr, normr0, &times[0], true);
    if (ierr) HPCG_fout << "Error in call to CG: " << ierr << ".\n" << endl;
    if (rank==0) HPCG_fout << "Call [" << i << "] Scaled Residual [" << normr/normr0 << "]" << endl;
    testnorms_data.values[i] = normr/normr0; // Record scaled residual from this run
  }

  // Compute difference between known exact solution and computed solution
  // All processors are needed here.
#ifdef HPCG_DEBUG
  double residual = 0;
  ierr = ComputeResidual(A.localNumberOfRows, x, xexact, residual);
  if (ierr) HPCG_fout << "Error in call to compute_residual: " << ierr << ".\n" << endl;
  if (rank==0) HPCG_fout << "Difference between computed and exact  = " << residual << ".\n" << endl;
#endif

  // Test Norm Results
  ierr = TestNorms(testnorms_data);

  ////////////////////
  // Report Results //
  ////////////////////

  // Report results to YAML file
  ReportResults(A, numberOfMgLevels, numberOfCgSets, refMaxIters, optMaxIters, &times[0], testcg_data, testsymmetry_data, testnorms_data, global_failure, quickPath);

  // Clean up
  DeleteMatrix(A); // This delete will recursively delete all coarse grid data
  DeleteCGData(data);
  DeleteVector(x);
  DeleteVector(b);
  DeleteVector(xexact);
  DeleteVector(x_overlap);
  DeleteVector(b_computed);
  delete [] testnorms_data.values;



  HPCG_Finalize();

  // Finish up
#ifndef HPCG_NO_MPI
  MPI_Finalize();
#endif
  return 0;
}